

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_dbg.c
# Opt level: O3

_Bool ecs_dbg_match_entity
                (ecs_world_t *world,ecs_entity_t entity,ecs_entity_t system,
                ecs_match_failure_t *failure_info_out)

{
  _Bool _Var1;
  void *pvVar2;
  ecs_dbg_entity_t dbg;
  ecs_dbg_entity_t eStack_38;
  
  ecs_dbg_entity(world,entity,&eStack_38);
  pvVar2 = ecs_get_w_entity(world,system,5);
  if (pvVar2 == (void *)0x0) {
    failure_info_out->reason = EcsMatchNotASystem;
    failure_info_out->column = -1;
    _Var1 = false;
  }
  else {
    _Var1 = ecs_query_match(world,eStack_38.table,*(ecs_query_t **)((long)pvVar2 + 0x18),
                            failure_info_out);
  }
  return _Var1;
}

Assistant:

bool ecs_dbg_match_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t system,
    ecs_match_failure_t *failure_info_out)
{
    ecs_dbg_entity_t dbg;
    ecs_dbg_entity(world, entity, &dbg);

    const EcsSystem *system_data = ecs_get(world, system, EcsSystem);
    if (!system_data) {
        failure_info_out->reason = EcsMatchNotASystem;
        failure_info_out->column = -1;
        return false;
    }

    return ecs_query_match(
        world, dbg.table, system_data->query, failure_info_out);
}